

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O3

void __thiscall TApp_MultiSubFallthrough_Test::TestBody(TApp_MultiSubFallthrough_Test *this)

{
  App *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  App *subcom;
  App *subcom_00;
  App *pAVar3;
  char *in_R9;
  long lVar4;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  AssertHelper local_1b0;
  AssertHelper local_1a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  string local_198;
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_158;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"sub1","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  this_00 = &(this->super_TApp).app;
  subcom = CLI::App::add_subcommand(this_00,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"sub2","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  subcom_00 = CLI::App::add_subcommand(this_00,&local_90,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"sub1","");
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"sub2","");
  local_158 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>(local_158,&local_198,&local_158);
  lVar4 = 0;
  do {
    if (local_168 + lVar4 != *(undefined1 **)((long)local_178 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_178 + lVar4));
    }
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x40);
  TApp::run(&this->super_TApp);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"sub1","");
  local_1a8.data_._0_1_ = (internal)CLI::App::got_subcommand(this_00,&local_d0);
  paVar1 = &local_198.field_2;
  local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
    if (!(bool)local_1a8.data_._0_1_) goto LAB_00111137;
  }
  else {
    operator_delete(local_d0._M_dataplus._M_p);
    if (((byte)local_1a8.data_._0_1_ & 1) == 0) {
LAB_00111137:
      testing::Message::Message((Message *)&local_1b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_198,(internal *)&local_1a8,(AssertionResult *)"app.got_subcommand(\"sub1\")"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
                 ,0x42,local_198._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1b8);
      testing::internal::AssertHelper::~AssertHelper(&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar1) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      if (((local_1b8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_1b8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1b8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pAVar3 = CLI::App::get_subcommand(this_00,subcom);
  local_1a8.data_._0_1_ = (internal)pAVar3->parsed_;
  local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1a8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)&local_1a8,(AssertionResult *)"app.got_subcommand(sub1)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x43,local_198._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar1) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if (((local_1b8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_1b8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_1b8.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8.data_._0_1_ = (internal)subcom->parsed_;
  local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1a8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)&local_1a8,(AssertionResult *)"*sub1","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x44,local_198._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar1) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if (((local_1b8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_1b8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_1b8.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8.data_._0_1_ = (internal)subcom->parsed_;
  local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1a8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)&local_1a8,(AssertionResult *)"sub1->parsed()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x45,local_198._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar1) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if (((local_1b8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_1b8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_1b8.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"sub2","");
  local_1a8.data_._0_1_ = (internal)CLI::App::got_subcommand(this_00,&local_f0);
  local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
    if (!(bool)local_1a8.data_._0_1_) goto LAB_00111487;
  }
  else {
    operator_delete(local_f0._M_dataplus._M_p);
    if (((byte)local_1a8.data_._0_1_ & 1) == 0) {
LAB_00111487:
      testing::Message::Message((Message *)&local_1b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_198,(internal *)&local_1a8,(AssertionResult *)"app.got_subcommand(\"sub2\")"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
                 ,0x47,local_198._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1b8);
      testing::internal::AssertHelper::~AssertHelper(&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar1) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      if (((local_1b8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_1b8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1b8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pAVar3 = CLI::App::get_subcommand(this_00,subcom_00);
  local_1a8.data_._0_1_ = (internal)pAVar3->parsed_;
  local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1a8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)&local_1a8,(AssertionResult *)"app.got_subcommand(sub2)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x48,local_198._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar1) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if (((local_1b8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_1b8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_1b8.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8.data_._0_1_ = (internal)subcom_00->parsed_;
  local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1a8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)&local_1a8,(AssertionResult *)"*sub2","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x49,local_198._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar1) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if (((local_1b8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_1b8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_1b8.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CLI::App::reset(this_00);
  (this->super_TApp).app.require_subcommand_min_ = 1;
  (this->super_TApp).app.require_subcommand_max_ = 0;
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  (this->super_TApp).app.require_subcommand_min_ = 2;
  (this->super_TApp).app.require_subcommand_max_ = 2;
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  (this->super_TApp).app.require_subcommand_min_ = 1;
  (this->super_TApp).app.require_subcommand_max_ = 1;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)&local_198);
  testing::internal::AssertHelper::AssertHelper
            (&local_1a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x58,
             "Expected: run() throws an exception of type CLI::ExtrasError.\n  Actual: it throws nothing."
            );
  paVar1 = &local_198.field_2;
  testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_198);
  testing::internal::AssertHelper::~AssertHelper(&local_1a8);
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_198._M_dataplus._M_p + 8))();
  }
  CLI::App::reset(this_00);
  local_198._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"sub1","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>(local_158,&local_198,local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  TApp::run(&this->super_TApp);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"sub1","");
  local_1a8.data_._0_1_ = (internal)CLI::App::got_subcommand(this_00,&local_110);
  local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p == &local_110.field_2) {
    if (!(bool)local_1a8.data_._0_1_) goto LAB_00111853;
  }
  else {
    operator_delete(local_110._M_dataplus._M_p);
    if (((byte)local_1a8.data_._0_1_ & 1) == 0) {
LAB_00111853:
      testing::Message::Message((Message *)&local_1b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_198,(internal *)&local_1a8,(AssertionResult *)"app.got_subcommand(\"sub1\")"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
                 ,0x5e,local_198._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1b8);
      testing::internal::AssertHelper::~AssertHelper(&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar1) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      if (((local_1b8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_1b8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1b8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"sub2","");
  bVar2 = CLI::App::got_subcommand(this_00,&local_130);
  local_1a8.data_._0_1_ = (internal)!bVar2;
  local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p == &local_130.field_2) {
    if (!bVar2) goto LAB_001119fb;
  }
  else {
    operator_delete(local_130._M_dataplus._M_p);
    if (((byte)local_1a8.data_._0_1_ & 1) != 0) goto LAB_001119fb;
  }
  testing::Message::Message((Message *)&local_1b8);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_198,(internal *)&local_1a8,(AssertionResult *)"app.got_subcommand(\"sub2\")",
             "true","false",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_1b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x5f,local_198._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1b8);
  testing::internal::AssertHelper::~AssertHelper(&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if (((local_1b8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_1b8.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_1b8.ptr_ + 8))();
  }
LAB_001119fb:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8.data_._0_1_ = (internal)subcom->parsed_;
  local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1a8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)&local_1a8,(AssertionResult *)"*sub1","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x61,local_198._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar1) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if (((local_1b8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_1b8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_1b8.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8.data_._0_1_ = (internal)(subcom_00->parsed_ ^ 1);
  local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (subcom_00->parsed_ == true) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)&local_1a8,(AssertionResult *)"*sub2","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x62,local_198._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar1) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if (((local_1b8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_1b8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_1b8.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8.data_._0_1_ = (internal)(subcom_00->parsed_ ^ 1);
  local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (subcom_00->parsed_ == true) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)&local_1a8,(AssertionResult *)"sub2->parsed()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,99,local_198._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar1) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if (((local_1b8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_1b8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_1b8.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"sub3","");
    CLI::App::got_subcommand(this_00,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_198);
  testing::internal::AssertHelper::AssertHelper
            (&local_1a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x65,
             "Expected: app.got_subcommand(\"sub3\") throws an exception of type CLI::OptionNotFound.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_198);
  testing::internal::AssertHelper::~AssertHelper(&local_1a8);
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_198._M_dataplus._M_p + 8))();
  }
  return;
}

Assistant:

TEST_F(TApp, MultiSubFallthrough) {

    // No explicit fallthrough
    auto sub1 = app.add_subcommand("sub1");
    auto sub2 = app.add_subcommand("sub2");

    args = {"sub1", "sub2"};
    run();
    EXPECT_TRUE(app.got_subcommand("sub1"));
    EXPECT_TRUE(app.got_subcommand(sub1));
    EXPECT_TRUE(*sub1);
    EXPECT_TRUE(sub1->parsed());

    EXPECT_TRUE(app.got_subcommand("sub2"));
    EXPECT_TRUE(app.got_subcommand(sub2));
    EXPECT_TRUE(*sub2);

    app.reset();
    app.require_subcommand();

    run();

    app.reset();
    app.require_subcommand(2);

    run();

    app.reset();
    app.require_subcommand(1);

    EXPECT_THROW(run(), CLI::ExtrasError);

    app.reset();
    args = {"sub1"};
    run();

    EXPECT_TRUE(app.got_subcommand("sub1"));
    EXPECT_FALSE(app.got_subcommand("sub2"));

    EXPECT_TRUE(*sub1);
    EXPECT_FALSE(*sub2);
    EXPECT_FALSE(sub2->parsed());

    EXPECT_THROW(app.got_subcommand("sub3"), CLI::OptionNotFound);
}